

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink6.c
# Opt level: O2

Shr_Man_t * Shr_ManAlloc(Gia_Man_t *pGia)

{
  int iVar1;
  Shr_Man_t *pSVar2;
  Vec_Wrd_t *pVVar3;
  Vec_Int_t *pVVar4;
  Gia_Man_t *p;
  char *pcVar5;
  Bdc_Man_t *pBVar6;
  Rsb_Man_t *pRVar7;
  int nCap;
  
  pSVar2 = (Shr_Man_t *)calloc(1,0x80);
  pSVar2->nDivMax = 0x40;
  iVar1 = pGia->nObjs;
  nCap = iVar1 * 2;
  pSVar2->nNewSize = nCap;
  pSVar2->pGia = pGia;
  pVVar3 = Vec_WrdAlloc(1000);
  pSVar2->vFanMem = pVVar3;
  Vec_WrdPush(pVVar3,0xffffffffffffffff);
  pVVar4 = Vec_IntAlloc(nCap);
  pVVar4->nSize = nCap;
  if (pVVar4->pArray != (int *)0x0) {
    memset(pVVar4->pArray,0,(long)iVar1 << 3);
  }
  pSVar2->vObj2Fan = pVVar4;
  pVVar4 = Vec_IntAlloc(1000);
  pSVar2->vDivs = pVVar4;
  pVVar4 = Vec_IntAlloc(1000);
  pSVar2->vPrio = pVVar4;
  pVVar3 = Vec_WrdAlloc(nCap);
  pVVar3->nSize = nCap;
  memset(pVVar3->pArray,0,(long)iVar1 << 4);
  pSVar2->vTruths = pVVar3;
  pVVar3 = Vec_WrdAlloc(100);
  pSVar2->vDivTruths = pVVar3;
  pVVar4 = Vec_IntAlloc(6);
  pSVar2->vDivResub = pVVar4;
  pVVar4 = Vec_IntAlloc(6);
  pSVar2->vLeaves = pVVar4;
  p = Gia_ManStart(nCap);
  pSVar2->pNew = p;
  pcVar5 = Abc_UtilStrsav(pGia->pName);
  p->pName = pcVar5;
  pcVar5 = Abc_UtilStrsav(pGia->pSpec);
  p->pSpec = pcVar5;
  Gia_ManHashAlloc(p);
  Gia_ManCleanLevels(p,nCap);
  p->nObjs = nCap;
  Gia_ManIncrementTravId(p);
  p->nObjs = 1;
  (pSVar2->Pars).nVarsMax = 6;
  pBVar6 = Bdc_ManAlloc(&pSVar2->Pars);
  pSVar2->pManDec = pBVar6;
  pRVar7 = Rsb_ManAlloc(6,pSVar2->nDivMax,4,1);
  pSVar2->pManRsb = pRVar7;
  return pSVar2;
}

Assistant:

Shr_Man_t * Shr_ManAlloc( Gia_Man_t * pGia )
{
    Shr_Man_t * p;
    p = ABC_CALLOC( Shr_Man_t, 1 );
    p->nDivMax     = 64;
    p->nNewSize    = 2 * Gia_ManObjNum(pGia);
    p->pGia        = pGia;
    p->vFanMem     = Vec_WrdAlloc( 1000 );   Vec_WrdPush(p->vFanMem, -1); 
    p->vObj2Fan    = Vec_IntStart( p->nNewSize );
    p->vDivs       = Vec_IntAlloc( 1000 );
    p->vPrio       = Vec_IntAlloc( 1000 );
    p->vTruths     = Vec_WrdStart( p->nNewSize );
    p->vDivTruths  = Vec_WrdAlloc( 100 );
    p->vDivResub   = Vec_IntAlloc( 6 );
    p->vLeaves     = Vec_IntAlloc( 6 );
    // start new manager
    p->pNew        = Gia_ManStart( p->nNewSize );
    p->pNew->pName = Abc_UtilStrsav( pGia->pName );
    p->pNew->pSpec = Abc_UtilStrsav( pGia->pSpec );
    Gia_ManHashAlloc( p->pNew );
    Gia_ManCleanLevels( p->pNew, p->nNewSize );
    // allocate traversal IDs
    p->pNew->nObjs = p->nNewSize;
    Gia_ManIncrementTravId( p->pNew );
    p->pNew->nObjs = 1;
    // start decompostion
    p->Pars.nVarsMax = 6;
    p->Pars.fVerbose = 0;
    p->pManDec = Bdc_ManAlloc( &p->Pars );
    p->pManRsb = Rsb_ManAlloc( 6, p->nDivMax, 4, 1 );
    return p;
}